

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_stdout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_stdio_container_t stdio [2];
  undefined1 local_100 [8];
  uv_pipe_t out;
  int r;
  
  init_process_options("spawn_helper2",exit_cb);
  uVar2 = uv_default_loop();
  uv_pipe_init(uVar2,local_100,0);
  options.stdio = (uv_stdio_container_t *)&eval_a;
  eval_a._0_4_ = 0;
  stdio[0].data.file = 0x21;
  stdio[1]._0_8_ = local_100;
  options.stdio_count = 2;
  uVar2 = uv_default_loop();
  out.pipe_fname._4_4_ = uv_spawn(uVar2,&process,&options);
  if ((long)out.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x12f,"r","==","0",(long)out.pipe_fname._4_4_,"==",0);
    abort();
  }
  out.pipe_fname._4_4_ = uv_read_start(local_100,on_alloc,on_read);
  if ((long)out.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x132,"r","==","0",(long)out.pipe_fname._4_4_,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  out.pipe_fname._4_4_ = uv_run(uVar2,0);
  if ((long)out.pipe_fname._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x135,"r","==","0",(long)out.pipe_fname._4_4_,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x137,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x138,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  printf("output is: %s",output);
  iVar1 = strcmp("hello world\n",output);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x13a,"strcmp(\"hello world\\n\", output)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x13c,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_stdout) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper2", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* Once for process once for the pipe. */
  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\n", output));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}